

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP3Writer::DoPutSync(BP3Writer *this,Variable<float> *variable,float *data)

{
  int iVar1;
  BPInfo *blockInfo;
  ScopedTimer __var2167;
  
  if (DoPutSync(adios2::core::Variable<float>&,float_const*)::__var167 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoPutSync(adios2::core::Variable<float>&,float_const*)::__var167);
    if (iVar1 != 0) {
      DoPutSync::__var167 = (void *)ps_timer_create_("BP3Writer::Put");
      __cxa_guard_release(&DoPutSync(adios2::core::Variable<float>&,float_const*)::__var167);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var2167,DoPutSync::__var167);
  blockInfo = Variable<float>::SetBlockInfo
                        (variable,data,
                         *(size_t *)
                          ((this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3] + 0x1d8 +
                          (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),1);
  PutSyncCommon<float>(this,variable,blockInfo,true);
  std::
  vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
  ::pop_back(&variable->m_BlocksInfo);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2167);
  return;
}

Assistant:

void BP3Writer::InitParameters()
{
    m_BP3Serializer.Init(m_IO.m_Parameters, "in call to BP3::Open for writing");
    m_BP3Serializer.ResizeBuffer(m_BP3Serializer.m_Parameters.InitialBufferSize,
                                 "in call to BP3::Open to write");
}